

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O1

int __thiscall
TPZFrontSym<std::complex<float>_>::Local(TPZFrontSym<std::complex<float>_> *this,int64_t global)

{
  int iVar1;
  _ComplexT in_RAX;
  int iVar2;
  long lVar3;
  complex<float> local_28;
  
  lVar3 = (this->super_TPZFront<std::complex<float>_>).fLocal.fStore[global];
  if (lVar3 == -1) {
    local_28._M_value = in_RAX;
    if ((this->super_TPZFront<std::complex<float>_>).fFree.super_TPZManVector<int,_10>.
        super_TPZVec<int>.fNElements == 0) {
      lVar3 = (this->super_TPZFront<std::complex<float>_>).fFront;
      (this->super_TPZFront<std::complex<float>_>).fFront = lVar3 + 1;
    }
    else {
      iVar1 = TPZStack<int,_10>::Pop(&(this->super_TPZFront<std::complex<float>_>).fFree);
      lVar3 = (long)iVar1;
    }
    (this->super_TPZFront<std::complex<float>_>).fLocal.fStore[global] = lVar3;
    if ((this->super_TPZFront<std::complex<float>_>).fMaxFront <= lVar3) {
      iVar1 = (this->super_TPZFront<std::complex<float>_>).fExpandRatio;
      iVar2 = iVar1 + (int)lVar3;
      local_28._M_value = 0;
      TPZVec<std::complex<float>_>::Resize
                (&(this->super_TPZFront<std::complex<float>_>).fData,
                 (long)(((iVar1 + (int)lVar3 + 1) * iVar2) / 2),&local_28);
      (this->super_TPZFront<std::complex<float>_>).fMaxFront = iVar2;
    }
    if ((this->super_TPZFront<std::complex<float>_>).fGlobal.super_TPZVec<long>.fNElements <= lVar3)
    {
      TPZManVector<long,_10>::Resize
                (&(this->super_TPZFront<std::complex<float>_>).fGlobal,lVar3 + 1);
    }
    (this->super_TPZFront<std::complex<float>_>).fGlobal.super_TPZVec<long>.fStore[lVar3] = global;
  }
  return (int)lVar3;
}

Assistant:

void TPZFrontSym<std::complex<long double> >::DecomposeOneEquation(int64_t ieq, TPZEqnArray<std::complex<long double> > &eqnarray)
{
	DebugStop();
}